

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

char is_type(Translation_Data *translation_data,Scope *scope)

{
  token *id;
  int *piVar1;
  Denoted *thing;
  token *hold;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  id = (token *)translation_data->tokens->first->data;
  switch(id->type) {
  case KW_DOUBLE:
  case KW_INT:
  case KW_STRUCT:
  case KW_LONG:
  case KW_ENUM:
  case KW_TYPEDEF:
  case KW_CHAR:
  case KW_EXTERN:
  case KW_UNION:
  case KW_CONST:
  case KW_FLOAT:
  case KW_SHORT:
  case KW_VOID:
  case KW_VOLATILE:
  case KW_STATIC:
    translation_data_local._7_1_ = '\x01';
    break;
  default:
    translation_data_local._7_1_ = '\0';
    break;
  case KW_ID:
    piVar1 = (int *)check_ordinary(scope,id);
    if ((piVar1 == (int *)0x0) || (*piVar1 != 4)) {
      translation_data_local._7_1_ = '\0';
    }
    else {
      translation_data_local._7_1_ = '\x01';
    }
  }
  return translation_data_local._7_1_;
}

Assistant:

char is_type(struct Translation_Data *translation_data,struct Scope *scope)
{
	struct token *hold;
	struct Denoted *thing;

	hold=translation_data->tokens->first->data;

	switch(hold->type)
	{
		case KW_ID:
			thing=check_ordinary(scope,hold);
			if(thing!=NULL && thing->denotation==DT_Typedef) 
				return 1;
			else return 0;
		case KW_CONST:
		case KW_VOLATILE:
		case KW_INT:
		case KW_VOID:
		case KW_CHAR:
		case KW_DOUBLE:
		case KW_FLOAT:
		case KW_LONG:
		case KW_SHORT:
		case KW_EXTERN:
		case KW_STATIC:
		case KW_TYPEDEF:
		case KW_STRUCT:
		case KW_UNION:
		case KW_ENUM:
			return 1;
		default:
			return 0;

	}
}